

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# millisleep.c
# Opt level: O0

int millisecond_sleep(long milliseconds)

{
  int *piVar1;
  bool bVar2;
  undefined1 auStack_28 [4];
  int status;
  timespec sleep_time;
  long milliseconds_local;
  
  sleep_time.tv_nsec = milliseconds;
  if (milliseconds < 0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    milliseconds_local._4_4_ = -1;
  }
  else {
    _auStack_28 = milliseconds / 1000;
    sleep_time.tv_sec = (milliseconds % 1000) * 1000000;
    do {
      milliseconds_local._4_4_ = nanosleep((timespec *)auStack_28,(timespec *)auStack_28);
      bVar2 = false;
      if (milliseconds_local._4_4_ != 0) {
        piVar1 = __errno_location();
        bVar2 = *piVar1 == 4;
      }
    } while (bVar2);
  }
  return milliseconds_local._4_4_;
}

Assistant:

int millisecond_sleep(long milliseconds)
{
    struct timespec sleep_time;
    int status;

    if (milliseconds < 0)
    {
        errno = EINVAL;
        return -1;
    }

    sleep_time.tv_sec = milliseconds / 1000;
    sleep_time.tv_nsec = (milliseconds % 1000) * 1000000;

    do
    {
        status = nanosleep(&sleep_time, &sleep_time);
    }
    while (status && errno == EINTR);

    return status;
}